

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

pair<jsonip::holder,_const_jsonip::helper_*> __thiscall
jsonip::detail::stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_>::new_child
          (stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this,holder *h)

{
  vector<P,_std::allocator<P>_> *this_00;
  reference t_;
  holder *in_RDX;
  helper *extraout_RDX;
  pair<jsonip::holder,_const_jsonip::helper_*> pVar1;
  holder local_48;
  pair<jsonip::holder,_const_jsonip::detail::struct_helper<P>_*> local_40;
  P local_30;
  vector<P,_std::allocator<P>_> *local_28;
  vector<P,_std::allocator<P>_> *t;
  holder *h_local;
  stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this_local;
  
  h_local = h;
  this_local = this;
  this_00 = holder::get<std::vector<P,std::allocator<P>>>(in_RDX);
  local_28 = this_00;
  P::P(&local_30);
  std::vector<P,_std::allocator<P>_>::push_back(this_00,&local_30);
  t_ = std::vector<P,_std::allocator<P>_>::back(local_28);
  holder::holder<P>(&local_48,t_);
  calculate_helper<P>::instance();
  std::make_pair<jsonip::holder,jsonip::detail::struct_helper<P>const*>
            (&local_40.first,(struct_helper<P> **)&local_48);
  std::pair<jsonip::holder,_const_jsonip::helper_*>::
  pair<jsonip::holder,_const_jsonip::detail::struct_helper<P>_*,_true>
            ((pair<jsonip::holder,_const_jsonip::helper_*> *)this,&local_40);
  pVar1.second = extraout_RDX;
  pVar1.first.t = this;
  return pVar1;
}

Assistant:

std::pair<holder, const helper*> new_child(holder &h) const
        {
            T& t = h.get<T>();
            t.push_back(value_type());
            return std::make_pair(holder(&t.back()), slice_helper::instance());
        }